

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O1

int setuidgid_stub(expbuf_t *buf)

{
  uint uVar1;
  char *pcVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  void *pvVar6;
  int *piVar7;
  char *pcVar8;
  undefined8 uVar9;
  passwd *pw;
  passwd pwbuf;
  char pwstrbuf [65536];
  passwd *ppStack_10060;
  passwd pStack_10058;
  char acStack_10028 [65544];
  
  pcVar8 = buf->start;
  pcVar2 = buf->end;
  pvVar6 = memchr(pcVar8,0,(long)pcVar2 - (long)pcVar8);
  if (pvVar6 == (void *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    buf->start = (char *)((long)pvVar6 + 1);
  }
  if ((pcVar8 == (char *)0x0) ||
     (plVar3 = (long *)buf->start, (ulong)((long)pcVar2 - (long)plVar3) < 8)) {
    setuidgid_stub_cold_1();
    return -1;
  }
  lVar4 = *plVar3;
  buf->start = (char *)(plVar3 + 1);
  piVar7 = __errno_location();
  *piVar7 = 0;
  iVar5 = getpwnam_r(pcVar8,&pStack_10058,acStack_10028,0x10000,&ppStack_10060);
  if (iVar5 == 0) {
    if (ppStack_10060 == (passwd *)0x0) {
      warnf("%s: failed to obtain information of user:%s","setuidgid_stub",pcVar8);
    }
    else {
      if (lVar4 != 0) {
        iVar5 = chown(((daemon_vars.nb)->sun_).sun_path,ppStack_10060->pw_uid,ppStack_10060->pw_gid)
        ;
        pcVar8 = ((daemon_vars.nb)->sun_).sun_path;
        if (iVar5 != 0) {
LAB_0018cdc2:
          dief("chown failed for:%s",pcVar8);
        }
        pcVar8 = dirname(pcVar8);
        iVar5 = chown(pcVar8,ppStack_10060->pw_uid,ppStack_10060->pw_gid);
        if (iVar5 != 0) goto LAB_0018cdc2;
        free(pcVar8);
      }
      iVar5 = setgid(ppStack_10060->pw_gid);
      if (iVar5 == 0) {
        iVar5 = initgroups(ppStack_10060->pw_name,ppStack_10060->pw_gid);
        if (iVar5 != 0) {
          warnf("%s: initgroups(%s, %d) failed","setuidgid_stub",ppStack_10060->pw_name,
                (ulong)ppStack_10060->pw_gid);
          goto LAB_0018cd77;
        }
        iVar5 = setuid(ppStack_10060->pw_uid);
        if (iVar5 == 0) {
          uVar9 = 0;
          goto LAB_0018cd7e;
        }
        uVar1 = ppStack_10060->pw_uid;
        pcVar8 = "%s: setuid(%d) failed\n";
      }
      else {
        uVar1 = ppStack_10060->pw_gid;
        pcVar8 = "%s: setgid(%d) failed";
      }
      warnf(pcVar8,"setuidgid_stub",(ulong)uVar1);
    }
  }
  else {
    warnf("%s: getpwnam_r failed","setuidgid_stub");
  }
LAB_0018cd77:
  uVar9 = 0xffffffffffffffff;
LAB_0018cd7e:
  expbuf_dispose(buf);
  expbuf_reserve(buf,8);
  *(undefined8 *)buf->end = uVar9;
  buf->end = buf->end + 8;
  return 0;
}

Assistant:

static int setuidgid_stub(struct expbuf_t *buf)
{
    const char *user;
    size_t change_socket_ownership;
    struct passwd pwbuf, *pw;
    char pwstrbuf[65536]; /* should be large enough */
    int ret = -1;

    if ((user = expbuf_shift_str(buf)) == NULL || expbuf_shift_num(buf, &change_socket_ownership) != 0) {
        errno = 0;
        warnf("%s: failed to parse request", __FUNCTION__);
        return -1;
    }

    errno = 0;
    if (getpwnam_r(user, &pwbuf, pwstrbuf, sizeof(pwstrbuf), &pw) != 0) {
        warnf("%s: getpwnam_r failed", __FUNCTION__);
        goto Respond;
    }
    if (pw == NULL) {
        warnf("%s: failed to obtain information of user:%s", __FUNCTION__, user);
        goto Respond;
    }

    if (change_socket_ownership) {
        char *dir;
        if (chown(daemon_vars.nb->sun_.sun_path, pw->pw_uid, pw->pw_gid) != 0)
            dief("chown failed for:%s", daemon_vars.nb->sun_.sun_path);
        dir = dirname(daemon_vars.nb->sun_.sun_path);
        if (chown(dir, pw->pw_uid, pw->pw_gid) != 0)
            dief("chown failed for:%s", dir);
        free(dir);
    }

    /* setuidgid */
    if (setgid(pw->pw_gid) != 0) {
        warnf("%s: setgid(%d) failed", __FUNCTION__, (int)pw->pw_gid);
        goto Respond;
    }
    if (initgroups(pw->pw_name, pw->pw_gid) != 0) {
        warnf("%s: initgroups(%s, %d) failed", __FUNCTION__, pw->pw_name, (int)pw->pw_gid);
        goto Respond;
    }
    if (setuid(pw->pw_uid) != 0) {
        warnf("%s: setuid(%d) failed\n", __FUNCTION__, (int)pw->pw_uid);
        goto Respond;
    }
    ret = 0;

Respond:
    expbuf_dispose(buf);
    expbuf_push_num(buf, ret);
    return 0;
}